

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilterTest.cpp
# Opt level: O3

void __thiscall
TEST_TestFilter_emptyFilterMatchesEverything_Test::testBody
          (TEST_TestFilter_emptyFilterMatchesEverything_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString local_40;
  TestFilter filter;
  
  TestFilter::TestFilter(&filter);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_40,"random_name");
  bVar1 = TestFilter::match(&filter,&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","filter.match(\"random_name\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFilterTest.cpp"
             ,0x26,pTVar3);
  SimpleString::~SimpleString(&local_40);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_40,"");
  bVar1 = TestFilter::match(&filter,&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","filter.match(\"\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFilterTest.cpp"
             ,0x27,pTVar3);
  SimpleString::~SimpleString(&local_40);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_40,"*&%#^&%$(*&^@#(&*@#^(&*$^@#");
  bVar1 = TestFilter::match(&filter,&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","filter.match(\"*&%#^&%$(*&^@#(&*@#^(&*$^@#\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFilterTest.cpp"
             ,0x28,pTVar3);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&filter.filter_);
  return;
}

Assistant:

TEST(TestFilter, emptyFilterMatchesEverything)
{
    TestFilter filter;
    CHECK(filter.match("random_name"));
    CHECK(filter.match(""));
    CHECK(filter.match("*&%#^&%$(*&^@#(&*@#^(&*$^@#"));
}